

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.h
# Opt level: O0

Page * __thiscall Cache<SearchBase::Page>::add(Cache<SearchBase::Page> *this,Page *data)

{
  reference pvVar1;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_68;
  value_type local_60;
  Page *local_18;
  Page *data_local;
  Cache<SearchBase::Page> *this_local;
  
  local_18 = data;
  data_local = (Page *)this;
  freeInvalidComments(this);
  SearchBase::Page::Page(&local_60.data,data);
  local_68.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_60.expiration.__d.__r = (duration)std::chrono::operator+(&local_68,&this->validityTime);
  std::vector<Cache<SearchBase::Page>::Entry,_std::allocator<Cache<SearchBase::Page>::Entry>_>::
  push_back(&this->entries,&local_60);
  Entry::~Entry(&local_60);
  pvVar1 = std::
           vector<Cache<SearchBase::Page>::Entry,_std::allocator<Cache<SearchBase::Page>::Entry>_>::
           back(&this->entries);
  return &pvVar1->data;
}

Assistant:

T* add(T data) {
			freeInvalidComments();
			entries.push_back( { std::move(data), Clock::now() + validityTime });
			return &entries.back().data;
		}